

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

void __thiscall diligent_spirv_cross::ParsedIR::reset_all_of_type(ParsedIR *this,Types type)

{
  uint uVar1;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar2;
  size_t sVar3;
  Variant *pVVar4;
  long lVar5;
  
  pTVar2 = this->ids_for_type[type].
           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr;
  sVar3 = this->ids_for_type[type].
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
          buffer_size;
  for (lVar5 = 0; sVar3 << 2 != lVar5; lVar5 = lVar5 + 4) {
    uVar1 = *(uint *)((long)&pTVar2->id + lVar5);
    pVVar4 = (this->ids).super_VectorView<diligent_spirv_cross::Variant>.ptr;
    if (pVVar4[uVar1].type == type) {
      Variant::reset(pVVar4 + uVar1);
    }
  }
  this->ids_for_type[type].
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.buffer_size = 0;
  return;
}

Assistant:

void ParsedIR::reset_all_of_type(Types type)
{
	for (auto &id : ids_for_type[type])
		if (ids[id].get_type() == type)
			ids[id].reset();

	ids_for_type[type].clear();
}